

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::test_libskiwi_externals::test_libskiwi_externals
          (test_libskiwi_externals *this)

{
  test_libskiwi_externals *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture =
       (_func_int **)&PTR__test_libskiwi_externals_0032e890;
  return;
}

Assistant:

void test()
      {
      skiwi::skiwi_parameters pars;
      pars.heap_size = 1024 * 1024;
      skiwi::scheme_with_skiwi(&test_libskiwi_externals_register_fie, nullptr, pars);
      uint64_t value = skiwi_run_raw("(check-pair (cons 1 2))");
      TEST_EQ(1 << fixnum_shift, value);
      skiwi::skiwi_quit();
      }